

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAlloc(Abc_NtkType_t Type,Abc_NtkFunc_t Func,int fUseMemMan)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar2;
  Abc_Aig_t *pAVar3;
  Mem_Flex_t *pMVar4;
  DdManager *pDVar5;
  Hop_Man_t *pHVar6;
  void *pvVar7;
  Nm_Man_t *pNVar8;
  Mem_Step_t *local_30;
  Mem_Fixed_t *local_28;
  Abc_Ntk_t *pNtk;
  int fUseMemMan_local;
  Abc_NtkFunc_t Func_local;
  Abc_NtkType_t Type_local;
  
  pNtk_00 = (Abc_Ntk_t *)malloc(0x1c8);
  memset(pNtk_00,0,0x1c8);
  pNtk_00->ntkType = Type;
  pNtk_00->ntkFunc = Func;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vObjs = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vPios = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vPis = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vPos = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vCis = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vCos = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vBoxes = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pNtk_00->vLtlProperties = pVVar2;
  if (fUseMemMan == 0) {
    local_28 = (Mem_Fixed_t *)0x0;
  }
  else {
    local_28 = Mem_FixedStart(0x48);
  }
  pNtk_00->pMmObj = local_28;
  if (fUseMemMan == 0) {
    local_30 = (Mem_Step_t *)0x0;
  }
  else {
    local_30 = Mem_StepStart(10);
  }
  pNtk_00->pMmStep = local_30;
  pNtk_00->nTravIds = 1;
  iVar1 = Abc_NtkIsStrash(pNtk_00);
  if (iVar1 == 0) {
    Vec_PtrPush(pNtk_00->vObjs,(void *)0x0);
  }
  iVar1 = Abc_NtkIsStrash(pNtk_00);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasSop(pNtk_00);
    if ((iVar1 == 0) && (iVar1 = Abc_NtkHasBlifMv(pNtk_00), iVar1 == 0)) {
      iVar1 = Abc_NtkHasBdd(pNtk_00);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkHasAig(pNtk_00);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkHasMapping(pNtk_00);
          if (iVar1 == 0) {
            iVar1 = Abc_NtkHasBlackbox(pNtk_00);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNtk.c"
                            ,0x5a,"Abc_Ntk_t *Abc_NtkAlloc(Abc_NtkType_t, Abc_NtkFunc_t, int)");
            }
          }
          else {
            pvVar7 = Abc_FrameReadLibGen();
            pNtk_00->pManFunc = pvVar7;
          }
        }
        else {
          pHVar6 = Hop_ManStart();
          pNtk_00->pManFunc = pHVar6;
        }
      }
      else {
        pDVar5 = Cudd_Init(0x14,0,0x100,0x40000,0);
        pNtk_00->pManFunc = pDVar5;
      }
    }
    else {
      pMVar4 = Mem_FlexStart();
      pNtk_00->pManFunc = pMVar4;
    }
  }
  else {
    pAVar3 = Abc_AigAlloc(pNtk_00);
    pNtk_00->pManFunc = pAVar3;
  }
  pNVar8 = Nm_ManCreate(200);
  pNtk_00->pManName = pNVar8;
  pVVar2 = Vec_PtrStart(0xf);
  pNtk_00->vAttrs = pVVar2;
  pNtk_00->AndGateDelay = 0.0;
  return pNtk_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates a new Ntk.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Abc_NtkAlloc( Abc_NtkType_t Type, Abc_NtkFunc_t Func, int fUseMemMan )
{
    Abc_Ntk_t * pNtk;
    pNtk = ABC_ALLOC( Abc_Ntk_t, 1 );
    memset( pNtk, 0, sizeof(Abc_Ntk_t) );
    pNtk->ntkType     = Type;
    pNtk->ntkFunc     = Func;
    // start the object storage
    pNtk->vObjs       = Vec_PtrAlloc( 100 );
    pNtk->vPios       = Vec_PtrAlloc( 100 );
    pNtk->vPis        = Vec_PtrAlloc( 100 );
    pNtk->vPos        = Vec_PtrAlloc( 100 );
    pNtk->vCis        = Vec_PtrAlloc( 100 );
    pNtk->vCos        = Vec_PtrAlloc( 100 );
    pNtk->vBoxes      = Vec_PtrAlloc( 100 );
	pNtk->vLtlProperties = Vec_PtrAlloc( 100 );
    // start the memory managers
    pNtk->pMmObj      = fUseMemMan? Mem_FixedStart( sizeof(Abc_Obj_t) ) : NULL;
    pNtk->pMmStep     = fUseMemMan? Mem_StepStart( ABC_NUM_STEPS ) : NULL;
    // get ready to assign the first Obj ID
    pNtk->nTravIds    = 1;
    // start the functionality manager
    if ( !Abc_NtkIsStrash(pNtk) )
        Vec_PtrPush( pNtk->vObjs, NULL );
    if ( Abc_NtkIsStrash(pNtk) )
        pNtk->pManFunc = Abc_AigAlloc( pNtk );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        pNtk->pManFunc = Mem_FlexStart();
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNtk->pManFunc = Cudd_Init( 20, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNtk->pManFunc = Hop_ManStart();
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = Abc_FrameReadLibGen();
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // name manager
    pNtk->pManName = Nm_ManCreate( 200 );
    // attribute manager
    pNtk->vAttrs = Vec_PtrStart( VEC_ATTR_TOTAL_NUM );
    // estimated AndGateDelay
    pNtk->AndGateDelay = 0.0;
    return pNtk;
}